

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t MicroOAAT(char *key,int len,uint32_t seed)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  int iVar5;
  
  uVar3 = seed >> 0x11 | seed << 0xf;
  uVar2 = seed ^ 0x3b00;
  if (0 < len) {
    pbVar4 = (byte *)(key + len);
    do {
      bVar1 = *key;
      key = (char *)((byte *)key + 1);
      iVar5 = bVar1 + uVar2;
      uVar3 = uVar3 + iVar5 * -9;
      uVar2 = (uint)(iVar5 * 9) >> 0x19 | iVar5 * 0x480;
    } while (key < pbVar4);
  }
  return uVar2 ^ uVar3;
}

Assistant:

uint32_t
MicroOAAT(const char *key, int len, uint32_t seed) {
#define grol(x,n) (((x)<<(n))|((x)>>(32-(n))))
#define gror(x,n) (((x)>>(n))|((x)<<(32-(n))))
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint32_t h1 = seed ^ 0x3b00;
  uint32_t h2 = grol(seed, 15);
  while (str < end) {
    h1 += *str++;
    h1 += h1 << 3; // h1 *= 9
    h2 -= h1;
    // unfortunately, clang produces bad code here,
    // cause it doesn't generate rotl instruction.
    h1 = grol(h1, 7);
  }
  return h1 ^ h2;
#undef grol
#undef gror
}